

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

ON_PolynomialSurface * __thiscall
ON_PolynomialSurface::operator=(ON_PolynomialSurface *this,ON_PolynomialSurface *src)

{
  undefined8 uVar1;
  bool bVar2;
  
  if (this != src) {
    bVar2 = Create(this,src->m_dim,src->m_is_rat != 0,src->m_order[0],src->m_order[1]);
    if (bVar2) {
      ON_4dPointArray::operator=(&this->m_cv,&src->m_cv);
      uVar1 = *(undefined8 *)&src->field_0x30;
      *(undefined8 *)&this->field_0x28 = *(undefined8 *)&src->field_0x28;
      *(undefined8 *)&this->field_0x30 = uVar1;
      uVar1 = *(undefined8 *)&src->field_0x40;
      *(undefined8 *)&this->field_0x38 = *(undefined8 *)&src->field_0x38;
      *(undefined8 *)&this->field_0x40 = uVar1;
    }
  }
  return this;
}

Assistant:

ON_PolynomialSurface& ON_PolynomialSurface::operator=(const ON_PolynomialSurface& src)
{
  if ( this != &src ) {
    if ( Create( src.m_dim, src.m_is_rat, src.m_order[0], src.m_order[1] ) ) {
      m_cv = src.m_cv;
      m_domain[0] = src.m_domain[0];
      m_domain[1] = src.m_domain[1];
    }
  }
  return *this;
}